

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_type sVar1;
  char *pcVar2;
  _Alloc_hider _Var3;
  int iVar4;
  undefined4 extraout_var;
  bool bVar5;
  undefined1 local_8430 [8];
  ElectricityBill bill;
  HttpServer server;
  EventLoop loop;
  InetAddress address;
  string log_path;
  _Any_data local_58;
  undefined1 local_48 [24];
  
  address._32_8_ = &log_path._M_string_length;
  log_path._M_dataplus._M_p = (pointer)0x0;
  log_path._M_string_length._0_1_ = 0;
  log_path.field_2._8_8_ = 0;
  bVar5 = false;
  while( true ) {
    while( true ) {
      iVar4 = getopt(argc,argv,"w:l:d");
      _Var3 = log_path._M_dataplus;
      pcVar2 = _optarg;
      sVar1 = web_root_abi_cxx11_._M_string_length;
      if (iVar4 < 0x77) break;
      if (iVar4 == 0x77) {
        strlen(_optarg);
        std::__cxx11::string::_M_replace(0x1333a8,0,(char *)sVar1,(ulong)pcVar2);
      }
    }
    if (iVar4 == -1) break;
    if (iVar4 == 100) {
      log_path.field_2._8_8_ = CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
    }
    else if (iVar4 == 0x6c) {
      strlen(_optarg);
      bVar5 = true;
      std::__cxx11::string::_M_replace((ulong)&address.port_,0,_Var3._M_p,(ulong)pcVar2);
    }
  }
  if ((log_path.field_2._8_8_ & 1) != 0) {
    printf("daemon run");
    higan::System::DaemonRun();
  }
  if (bVar5) {
    local_8430 = (undefined1  [8])&bill.text_root_;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8430,"df","");
    higan::Logger::SetLogToFile((string *)&address.port_,(string *)local_8430,false);
    if (local_8430 != (undefined1  [8])&bill.text_root_) {
      operator_delete((void *)local_8430,(ulong)(bill.text_root_._M_dataplus._M_p + 1));
    }
  }
  signal(0xd,(__sighandler_t)0x1);
  higan::EventLoop::EventLoop((EventLoop *)&server.on_http_request_._M_invoker);
  ElectricityBill::ElectricityBill
            ((ElectricityBill *)local_8430,(EventLoop *)&server.on_http_request_._M_invoker,
             &web_root_abi_cxx11_);
  g_bill = (ElectricityBill *)local_8430;
  higan::InetAddress::InetAddress((InetAddress *)&loop.timer_manager_.min_expire_time,4000);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ElectricityBill","");
  higan::HttpServer::HttpServer
            ((HttpServer *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (EventLoop *)&server.on_http_request_._M_invoker,
             (InetAddress *)&loop.timer_manager_.min_expire_time,(string *)&local_58);
  if ((undefined1 *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48._0_8_ + 1));
  }
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = OnHttpRequest;
  local_48._8_8_ =
       std::
       _Function_handler<void_(const_std::shared_ptr<higan::TcpConnection>_&,_const_higan::HttpRequest_&,_higan::HttpResponse_&),_void_(*)(const_std::shared_ptr<higan::TcpConnection>_&,_const_higan::HttpRequest_&,_higan::HttpResponse_&)>
       ::_M_invoke;
  local_48._0_8_ =
       std::
       _Function_handler<void_(const_std::shared_ptr<higan::TcpConnection>_&,_const_higan::HttpRequest_&,_higan::HttpResponse_&),_void_(*)(const_std::shared_ptr<higan::TcpConnection>_&,_const_higan::HttpRequest_&,_higan::HttpResponse_&)>
       ::_M_manager;
  higan::HttpServer::SetHttpRequestCallback
            ((HttpServer *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(HttpCallback *)&local_58);
  if ((code *)local_48._0_8_ != (code *)0x0) {
    (*(code *)local_48._0_8_)(&local_58,&local_58,3);
  }
  higan::HttpServer::Start
            ((HttpServer *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  higan::EventLoop::Loop((EventLoop *)&server.on_http_request_._M_invoker);
  higan::HttpServer::~HttpServer
            ((HttpServer *)
             &bill.room_informations_.super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((size_type *)loop.timer_manager_.min_expire_time.microsecond_time_ !=
      &address.ip_._M_string_length) {
    operator_delete((void *)loop.timer_manager_.min_expire_time.microsecond_time_,
                    address.ip_._M_string_length + 1);
  }
  ElectricityBill::~ElectricityBill((ElectricityBill *)local_8430);
  higan::EventLoop::~EventLoop((EventLoop *)&server.on_http_request_._M_invoker);
  if ((size_type *)address._32_8_ != &log_path._M_string_length) {
    operator_delete((void *)address._32_8_,
                    CONCAT71(log_path._M_string_length._1_7_,(undefined1)log_path._M_string_length)
                    + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	bool daemon = false;
	bool log_to_file = false;
	std::string log_path;

	int opt = -1;
	while ((opt = getopt(argc, argv, "w:l:d")) != -1)
	{
		switch (opt)
		{
			case 'w':
			{
				web_root = optarg;
				break;
			}
			case 'l':
			{
				log_to_file = true;
				log_path = optarg;
				break;
			}
			case 'd':
			{
				daemon = true;
				break;
			}
			default:
				break;
		}
	}

	if (daemon)
	{
		printf("daemon run");
		higan::System::DaemonRun();
	}
	if (log_to_file)
	{
		higan::Logger::SetLogToFile(log_path, "df", false);
	}

	signal(SIGPIPE, SIG_IGN);

	higan::EventLoop loop;

	ElectricityBill bill(&loop, web_root);
	g_bill = &bill;

	higan::InetAddress address{4000};

	higan::HttpServer server{&loop, address, "ElectricityBill"};
	server.SetHttpRequestCallback(OnHttpRequest);

	server.Start();
	loop.Loop();

	return 0;
}